

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieElement::compareStringTo
          (UCharsTrieElement *this,UCharsTrieElement *other,UnicodeString *strings)

{
  int8_t iVar1;
  UnicodeString local_a0;
  UnicodeString local_60;
  UnicodeString *local_20;
  UnicodeString *strings_local;
  UCharsTrieElement *other_local;
  UCharsTrieElement *this_local;
  
  local_20 = strings;
  strings_local = (UnicodeString *)other;
  other_local = this;
  getString(&local_60,this,strings);
  getString(&local_a0,(UCharsTrieElement *)strings_local,local_20);
  iVar1 = UnicodeString::compare(&local_60,&local_a0);
  UnicodeString::~UnicodeString(&local_a0);
  UnicodeString::~UnicodeString(&local_60);
  return (int)iVar1;
}

Assistant:

int32_t
UCharsTrieElement::compareStringTo(const UCharsTrieElement &other, const UnicodeString &strings) const {
    return getString(strings).compare(other.getString(strings));
}